

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.h
# Opt level: O3

bool __thiscall
soul::UTF8Reader::advanceIfStartsWith<char_const*>(UTF8Reader *this,char *text,char *others)

{
  byte bVar1;
  UTF8Reader UVar2;
  UnicodeChar UVar3;
  bool bVar4;
  UTF8Reader t;
  UTF8Reader local_38;
  
  UVar2 = (UTF8Reader)this->data;
  local_38.data = UVar2.data;
  do {
    bVar1 = *text;
    if (bVar1 == 0) {
      this->data = (char *)local_38;
      return true;
    }
    text = (char *)((byte *)text + 1);
    UVar3 = getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  do {
    local_38.data = UVar2.data;
    bVar1 = *others;
    bVar4 = bVar1 == 0;
    if (bVar4) {
      this->data = (char *)local_38;
      return bVar4;
    }
    others = (char *)((byte *)others + 1);
    UVar3 = getAndAdvance(&local_38);
    UVar2.data = local_38.data;
  } while (UVar3 == bVar1);
  return bVar4;
}

Assistant:

bool advanceIfStartsWith (const char* text, Args... others)      { return advanceIfStartsWith (text) || advanceIfStartsWith (others...); }